

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::facet_in_envelope_recursive
          (BVH *this,VectorMax3d *p,double sq_epsilon,int *nearest_f,VectorMax3d *nearest_point,
          double *sq_dist,int n,int b,int e)

{
  int b_00;
  int n_00;
  int n_01;
  const_reference pvVar1;
  size_type sVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  double dr;
  double dl;
  int childr;
  int childl;
  int m;
  double cur_sq_dist;
  VectorMax3d cur_nearest_point;
  int n_local;
  double *sq_dist_local;
  VectorMax3d *nearest_point_local;
  int *nearest_f_local;
  double sq_epsilon_local;
  VectorMax3d *p_local;
  BVH *this_local;
  
  cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows.
  _4_4_ = n;
  if (e <= b) {
    __assert_fail("e > b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x1e2,
                  "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                 );
  }
  if (sq_epsilon < *sq_dist) {
    if (b + 1 == e) {
      Eigen::Matrix<double,_-1,_1,_0,_3,_1>::Matrix((Matrix<double,__1,_1,_0,_3,_1> *)&cur_sq_dist);
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->new2old,(long)b);
      leaf_callback(this,p,*pvVar1,(VectorMax3d *)&cur_sq_dist,(double *)&childl);
      if (_childl < *sq_dist) {
        *nearest_f = b;
        Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=
                  (nearest_point,(Matrix<double,__1,_1,_0,_3,_1> *)&cur_sq_dist);
        *sq_dist = _childl;
      }
    }
    else {
      b_00 = b + (e - b) / 2;
      n_00 = n << 1;
      n_01 = n * 2 + 1;
      sVar2 = std::
              vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
              ::size(&this->boxlist);
      if (sVar2 <= (ulong)(long)n_00) {
        __assert_fail("childl < boxlist.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x1f9,
                      "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                     );
      }
      sVar2 = std::
              vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
              ::size(&this->boxlist);
      if (sVar2 <= (ulong)(long)n_01) {
        __assert_fail("childr < boxlist.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x1fa,
                      "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                     );
      }
      pvVar3 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)n_00);
      dVar4 = anon_unknown_6::point_box_signed_squared_distance(p,pvVar3);
      pvVar3 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)n_01);
      dVar5 = anon_unknown_6::point_box_signed_squared_distance(p,pvVar3);
      if (dVar5 <= dVar4) {
        if ((dVar5 < *sq_dist) && (dVar5 <= sq_epsilon)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_01,b_00,e)
          ;
        }
        if ((dVar4 < *sq_dist) && (dVar4 <= sq_epsilon)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_00,b,b_00)
          ;
        }
      }
      else {
        if ((dVar4 < *sq_dist) && (dVar4 <= sq_epsilon)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_00,b,b_00)
          ;
        }
        if ((dVar5 < *sq_dist) && (dVar5 <= sq_epsilon)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_01,b_00,e)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void BVH::facet_in_envelope_recursive(
    const VectorMax3d& p,
    double sq_epsilon,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist,
    int n,
    int b,
    int e) const
{
    assert(e > b);

    if (sq_dist <= sq_epsilon) {
        return;
    }

    // If node is a leaf: compute point-facet distance
    // and replace current if nearer
    if (b + 1 == e) {
        VectorMax3d cur_nearest_point;
        double cur_sq_dist;
        leaf_callback(p, new2old[b], cur_nearest_point, cur_sq_dist);
        if (cur_sq_dist < sq_dist) {
            nearest_f = b;
            nearest_point = cur_nearest_point;
            sq_dist = cur_sq_dist;
        }
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * n;
    int childr = 2 * n + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    double dl = point_box_signed_squared_distance(p, boxlist[childl]);
    double dr = point_box_signed_squared_distance(p, boxlist[childr]);

    // Traverse the "nearest" child first, so that it has more chances
    // to prune the traversal of the other child.
    if (dl < dr) {
        if (dl < sq_dist && dl <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
        if (dr < sq_dist && dr <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
    } else {
        if (dr < sq_dist && dr <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
        if (dl < sq_dist && dl <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
    }
}